

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

bool is_repeat(Node *test)

{
  long lVar1;
  bool local_89;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  int local_58;
  int local_54;
  int j;
  int i;
  char c;
  allocator local_39;
  string local_38 [8];
  string board_hash;
  Node *test_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  for (local_54 = 2; local_54 < 10; local_54 = local_54 + 1) {
    for (local_58 = 2; local_58 < 10; local_58 = local_58 + 1) {
      j._3_1_ = (*test)->board[local_54][local_58];
      if (j._3_1_ == ' ') {
        std::__cxx11::string::operator+=(local_38,'0');
      }
      else {
        std::__cxx11::string::operator+=(local_38,j._3_1_);
      }
    }
  }
  lVar1 = std::__cxx11::string::size();
  local_89 = true;
  if (lVar1 != 0) {
    local_68._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&prev_moves_abi_cxx11_);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&prev_moves_abi_cxx11_);
    local_60 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_68,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_70,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
    local_78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&prev_moves_abi_cxx11_);
    local_89 = __gnu_cxx::operator==(&local_60,&local_78);
  }
  if (local_89 != false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&prev_moves_abi_cxx11_,(value_type *)local_38);
  }
  test_local._7_1_ = local_89 == false;
  std::__cxx11::string::~string(local_38);
  return test_local._7_1_;
}

Assistant:

bool is_repeat(Node& test){

    string board_hash = "";
    char c;
    int i, j;

    for(i=2; i<10; i++){
        for(j=2; j<10; j++){
            c = test->board[i][j];
            if(' ' != c)
                board_hash += c;
            else
                board_hash += '0';
        }
    }

    if(0 == board_hash.size() || find(prev_moves.begin(), prev_moves.end(), board_hash) == prev_moves.end()){
        prev_moves.push_back(board_hash);
        // cout << "NEW HASH :: " << board_hash << endl;
        return false;
    }
    // cout << "OLD HASH :: " << board_hash << endl;
    return true;
}